

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

bool google::protobuf::internal::InternalPackFromLite
               (MessageLite *message,string_view type_url_prefix,string_view type_name,
               UrlType *dst_url,ValueType *dst_value)

{
  bool bVar1;
  string_view message_name;
  string_view type_url_prefix_00;
  string local_40;
  
  message_name._M_str = (char *)type_url_prefix._M_len;
  message_name._M_len = (size_t)type_name._M_str;
  type_url_prefix_00._M_str = (char *)type_url_prefix._M_len;
  type_url_prefix_00._M_len = (size_t)type_url_prefix._M_str;
  GetTypeUrl_abi_cxx11_(&local_40,(internal *)type_name._M_len,message_name,type_url_prefix_00);
  std::__cxx11::string::operator=((string *)dst_url,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar1 = MessageLite::SerializeToString(message,dst_value);
  return bVar1;
}

Assistant:

bool InternalPackFromLite(const MessageLite& message,
                          absl::string_view type_url_prefix,
                          absl::string_view type_name, UrlType* dst_url,
                          ValueType* dst_value) {
  *dst_url = GetTypeUrl(type_name, type_url_prefix);
  return message.SerializeToString(dst_value);
}